

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

void * MRIStepCreate(ARKRhsFn fse,ARKRhsFn fsi,realtype t0,N_Vector y0,MRIStepInnerStepper stepper,
                    SUNContext sunctx)

{
  int iVar1;
  uint uVar2;
  N_Vector y;
  void *in_RCX;
  N_Vector in_RDX;
  N_Vector_Ops in_RSI;
  void *in_RDI;
  ARKodeMem in_R8;
  int retval;
  int nvectorOK;
  SUNNonlinearSolver NLS;
  ARKodeMRIStepMem step_mem;
  ARKodeMem ark_mem;
  SUNContext in_stack_ffffffffffffffb0;
  SUNContext in_stack_ffffffffffffffb8;
  ARKodeMem local_8;
  
  if ((in_RDI == (void *)0x0) && (in_RSI == (N_Vector_Ops)0x0)) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepCreate",
                    "Must specify at least one of fe, fi (both NULL).");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RDX == (N_Vector)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepCreate","y0 = NULL illegal.");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_RCX == (void *)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepCreate",
                    "The inner stepper memory is NULL");
    local_8 = (ARKodeMem)0x0;
  }
  else if (in_R8 == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepCreate","sunctx = NULL illegal.")
    ;
    local_8 = (ARKodeMem)0x0;
  }
  else {
    iVar1 = mriStep_CheckNVector(in_RDX);
    if (iVar1 == 0) {
      arkProcessError((ARKodeMem)0x0,-0x16,"ARKode::MRIStep","MRIStepCreate",
                      "A required vector operation is not implemented.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      local_8 = arkCreate(in_stack_ffffffffffffffb8);
      if (local_8 == (ARKodeMem)0x0) {
        arkProcessError((ARKodeMem)0x0,-0x15,"ARKode::MRIStep","MRIStepCreate",
                        "arkode_mem = NULL illegal.");
        local_8 = (ARKodeMem)0x0;
      }
      else {
        y = (N_Vector)malloc(0x1a8);
        if (y == (N_Vector)0x0) {
          arkProcessError(local_8,-0x14,"ARKode::MRIStep","MRIStepCreate",
                          "Allocation of arkode_mem failed.");
          MRIStepFree(&local_8->sunctx);
          local_8 = (ARKodeMem)0x0;
        }
        else {
          memset(y,0,0x1a8);
          local_8->step_attachlinsol = mriStep_AttachLinsol;
          local_8->step_disablelsetup = mriStep_DisableLSetup;
          local_8->step_getlinmem = mriStep_GetLmem;
          local_8->step_getimplicitrhs = mriStep_GetImplicitRHS;
          local_8->step_getgammas = mriStep_GetGammas;
          local_8->step_init = mriStep_Init;
          local_8->step_fullrhs = mriStep_FullRHS;
          local_8->step = mriStep_TakeStep;
          local_8->step_mem = y;
          uVar2 = MRIStepSetDefaults(y);
          if (uVar2 == 0) {
            y->content = in_RDI;
            y->ops = in_RSI;
            *(uint *)&y[1].content = (uint)(in_RDI != (void *)0x0);
            *(uint *)((long)&y[1].content + 4) = (uint)(in_RSI != (N_Vector_Ops)0x0);
            local_8->liw = local_8->liw + 0x2a;
            local_8->lrw = local_8->lrw + 10;
            y[6].content = (void *)0x0;
            *(undefined4 *)&y[6].ops = 0;
            if (*(int *)((long)&y[1].content + 4) != 0) {
              in_stack_ffffffffffffffb0 =
                   (SUNContext)SUNNonlinSol_Newton(y,in_stack_ffffffffffffffb0);
              if (in_stack_ffffffffffffffb0 == (SUNContext)0x0) {
                arkProcessError(local_8,-0x14,"ARKode::MRIStep","MRIStepCreate",
                                "Error creating default Newton solver");
                MRIStepFree(&local_8->sunctx);
                return (void *)0x0;
              }
              iVar1 = MRIStepSetNonlinearSolver(in_R8,(SUNNonlinearSolver)local_8);
              if (iVar1 != 0) {
                arkProcessError(local_8,-0x14,"ARKode::MRIStep","MRIStepCreate",
                                "Error attaching default Newton solver");
                MRIStepFree(&local_8->sunctx);
                return (void *)0x0;
              }
              *(undefined4 *)&y[6].ops = 1;
            }
            y[0xc].ops = (N_Vector_Ops)0x0;
            y[0xc].sunctx = (SUNContext)0x0;
            y[0xd].content = (void *)0x0;
            y[0xd].ops = (N_Vector_Ops)0x0;
            y[0xd].sunctx = (SUNContext)0x0;
            y[0xf].content = (void *)0x0;
            y[0xf].ops = (N_Vector_Ops)0x0;
            y[0xf].sunctx = (SUNContext)0x0;
            y[0xb].content = (void *)0x0;
            y[0x10].content = (void *)0x0;
            y[0x10].ops = (N_Vector_Ops)0x0;
            y[0x11].content = (void *)0x0;
            y[0x11].ops = (N_Vector_Ops)0x0;
            y[0xe].ops = (N_Vector_Ops)0x0;
            y[0xe].sunctx = (SUNContext)0x0;
            uVar2 = arkInit(in_R8,(realtype)local_8,y,
                            (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
            if (uVar2 == 0) {
              y[0xe].content = in_RCX;
              iVar1 = mriStepInnerStepper_HasRequiredOps((MRIStepInnerStepper)y[0xe].content);
              if (iVar1 != 0) {
                arkProcessError(local_8,-0x16,"ARKode::MRIStep","MRIStepCreate",
                                "A required inner stepper function is NULL");
                MRIStepFree(&local_8->sunctx);
                local_8 = (ARKodeMem)0x0;
              }
            }
            else {
              arkProcessError(local_8,(int)(ulong)uVar2,"ARKode::MRIStep","MRIStepCreate",
                              "Unable to initialize main ARKode infrastructure");
              MRIStepFree(&local_8->sunctx);
              local_8 = (ARKodeMem)0x0;
            }
          }
          else {
            arkProcessError(local_8,(int)(ulong)uVar2,"ARKode::MRIStep","MRIStepCreate",
                            "Error setting default solver options");
            MRIStepFree(&local_8->sunctx);
            local_8 = (ARKodeMem)0x0;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

void* MRIStepCreate(ARKRhsFn fse, ARKRhsFn fsi, realtype t0, N_Vector y0,
                    MRIStepInnerStepper stepper, SUNContext sunctx)
{
  ARKodeMem          ark_mem;         /* outer ARKode memory   */
  ARKodeMRIStepMem   step_mem;        /* outer stepper memory  */
  SUNNonlinearSolver NLS;             /* default nonlin solver */
  booleantype        nvectorOK;
  int                retval;

  /* Check that at least one of fse, fsi is supplied and is to be used*/
  if (fse == NULL && fsi == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_F);
    return(NULL);
  }

  /* Check that y0 is supplied */
  if (y0 == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_Y0);
    return(NULL);
  }

  /* Check that stepper is supplied */
  if (stepper == NULL) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "The inner stepper memory is NULL");
    return(NULL);
  }

  /* Check that context is supplied */
  if (!sunctx) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NULL_SUNCTX);
    return(NULL);
  }

  /* Test if all required vector operations are implemented */
  nvectorOK = mriStep_CheckNVector(y0);
  if (!nvectorOK) {
    arkProcessError(NULL, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_BAD_NVECTOR);
    return(NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_NO_MEM);
    return(NULL);
  }

  /* Allocate ARKodeMRIStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeMRIStepMem) malloc(sizeof(struct ARKodeMRIStepMemRec));
  if (step_mem == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                    "MRIStepCreate", MSG_ARK_ARKMEM_FAIL);
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeMRIStepMemRec));

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_attachlinsol   = mriStep_AttachLinsol;
  ark_mem->step_disablelsetup  = mriStep_DisableLSetup;
  ark_mem->step_getlinmem      = mriStep_GetLmem;
  ark_mem->step_getimplicitrhs = mriStep_GetImplicitRHS;
  ark_mem->step_getgammas      = mriStep_GetGammas;
  ark_mem->step_init           = mriStep_Init;
  ark_mem->step_fullrhs        = mriStep_FullRHS;
  ark_mem->step                = mriStep_TakeStep;
  ark_mem->step_mem            = (void*) step_mem;

  /* Set default values for MRIStep optional inputs */
  retval = MRIStepSetDefaults((void *) ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "Error setting default solver options");
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }

  /* Allocate the general MRI stepper vectors using y0 as a template */
  /* NOTE: Fse, Fsi, inner_forcing, cvals, Xvecs, sdata, zpred and zcor will
     be allocated later on (based on the MRI method) */

  /* Copy the slow RHS functions into stepper memory */
  step_mem->fse = fse;
  step_mem->fsi = fsi;

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit_rhs = (fse == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit_rhs = (fsi == NULL) ? SUNFALSE : SUNTRUE;

  /* Update the ARKode workspace requirements */
  ark_mem->liw += 42;  /* fcn/data ptr, int, long int, sunindextype, booleantype */
  ark_mem->lrw += 10;

  /* Create a default Newton NLS object (just in case; will be deleted if
     the user attaches a nonlinear solver) */
  step_mem->NLS    = NULL;
  step_mem->ownNLS = SUNFALSE;

  if (step_mem->implicit_rhs) {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (!NLS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepCreate", "Error creating default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(NULL);
    }
    retval = MRIStepSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode::MRIStep",
                      "MRIStepCreate", "Error attaching default Newton solver");
      MRIStepFree((void**) &ark_mem);  return(NULL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Set the linear solver addresses to NULL (we check != NULL later) */
  step_mem->linit  = NULL;
  step_mem->lsetup = NULL;
  step_mem->lsolve = NULL;
  step_mem->lfree  = NULL;
  step_mem->lmem   = NULL;

  /* Initialize all the counters */
  step_mem->nfse      = 0;
  step_mem->nfsi      = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* Initialize fused op work space */
  step_mem->cvals        = NULL;
  step_mem->Xvecs        = NULL;

  /* Initialize pre and post inner evolve functions */
  step_mem->pre_inner_evolve  = NULL;
  step_mem->post_inner_evolve = NULL;

  /* Initialize main ARKode infrastructure (allocates vectors) */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepCreate",
                    "Unable to initialize main ARKode infrastructure");
    MRIStepFree((void**) &ark_mem);  return(NULL);
  }

  /* Attach the inner stepper memory */
  step_mem->stepper = stepper;

  /* Check for required stepper functions */
  retval = mriStepInnerStepper_HasRequiredOps(step_mem->stepper);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::MRIStep",
                    "MRIStepCreate",
                    "A required inner stepper function is NULL");
    MRIStepFree((void**) &ark_mem);
    return(NULL);
  }

  /* return ARKode memory */
  return((void*) ark_mem);
}